

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O2

int bandit::run(int argc,char **argv)

{
  int iVar1;
  spec_registry *specs;
  contextstack_t *context_stack;
  colorizer colorizer;
  failure_formatter_ptr formatter;
  options opt;
  colorizer local_41;
  listener *local_40;
  long *local_38;
  __uniq_ptr_impl<bandit::detail::failure_formatter,_std::default_delete<bandit::detail::failure_formatter>_>
  local_30;
  options local_28;
  
  detail::options::options(&local_28,argc,argv);
  detail::create_formatter((detail *)&local_30,&local_28);
  local_41.colors_enabled_ =
       local_28.options_.super__Vector_base<option::Option,_std::allocator<option::Option>_>._M_impl
       .super__Vector_impl_data._M_start[4].desc == (Descriptor *)0x0;
  detail::create_reporter
            ((detail *)&local_40,&local_28,
             (failure_formatter *)
             local_30._M_t.
             super__Tuple_impl<0UL,_bandit::detail::failure_formatter_*,_std::default_delete<bandit::detail::failure_formatter>_>
             .super__Head_base<0UL,_bandit::detail::failure_formatter_*,_false>._M_head_impl,
             &local_41);
  if (local_40 != (listener *)0x0) {
    detail::registered_listener(bandit::detail::listener*)::reporter_ = local_40;
  }
  detail::create_run_policy((detail *)&local_38,&local_28);
  if (local_38 != (long *)0x0) {
    detail::registered_run_policy(bandit::detail::run_policy*)::policy_ = local_38;
  }
  specs = detail::specs_abi_cxx11_();
  context_stack = detail::context_stack();
  iVar1 = run(&local_28,specs,context_stack,local_40);
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  if (local_40 != (listener *)0x0) {
    (*local_40->_vptr_listener[1])();
  }
  std::
  unique_ptr<bandit::detail::failure_formatter,_std::default_delete<bandit::detail::failure_formatter>_>
  ::~unique_ptr((unique_ptr<bandit::detail::failure_formatter,_std::default_delete<bandit::detail::failure_formatter>_>
                 *)&local_30);
  std::_Vector_base<option::Option,_std::allocator<option::Option>_>::~_Vector_base
            ((_Vector_base<option::Option,_std::allocator<option::Option>_> *)&local_28);
  return iVar1;
}

Assistant:

inline int run(int argc, char* argv[])
  {
    detail::options opt(argc, argv);
    detail::failure_formatter_ptr formatter(create_formatter(opt));
    bandit::detail::colorizer colorizer(!opt.no_color());
    detail::listener_ptr reporter(create_reporter(opt, formatter.get(), colorizer));

    detail::registered_listener(reporter.get());

    detail::run_policy_ptr run_policy = create_run_policy(opt);
    registered_run_policy(run_policy.get());

    return run(opt, detail::specs(), detail::context_stack(), *reporter);
  }